

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator_expression.hpp
# Opt level: O2

string * __thiscall
duckdb::OperatorExpression::ToString<duckdb::OperatorExpression,duckdb::ParsedExpression>
          (string *__return_storage_ptr__,OperatorExpression *this,OperatorExpression *entry)

{
  ExpressionType EVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  const_reference pvVar5;
  pointer pPVar6;
  InternalException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ExpressionType type;
  ExpressionType type_00;
  char *pcVar8;
  string *psVar9;
  SQLIdentifier *in_R8;
  idx_t i;
  ulong __n;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *pvVar10;
  string op_type;
  string in_child;
  string child_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string op;
  
  pbVar7 = &op_type;
  ExpressionTypeToOperator_abi_cxx11_
            (&op,(duckdb *)(ulong)(this->super_ParsedExpression).super_BaseExpression.type,
             (ExpressionType)entry);
  if (op._M_string_length != 0) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(&this->children,0);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_218,pPVar6);
    ::std::operator+(&child_list,&local_218," ");
    ::std::operator+(&in_child,&child_list,&op);
    ::std::operator+(&op_type,&in_child," ");
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(&this->children,1);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_1f8,pPVar6);
    ::std::operator+(__return_storage_ptr__,&op_type,&local_1f8);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    ::std::__cxx11::string::~string((string *)&op_type);
    ::std::__cxx11::string::~string((string *)&in_child);
    ::std::__cxx11::string::~string((string *)&child_list);
    pbVar7 = &local_218;
    goto LAB_013292ba;
  }
  EVar1 = (this->super_ParsedExpression).super_BaseExpression.type;
  switch(EVar1) {
  case OPERATOR_COALESCE:
switchD_013293cf_caseD_98:
    ExpressionTypeToString_abi_cxx11_(__return_storage_ptr__,(duckdb *)(ulong)EVar1,type);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar2 = (this->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::string((string *)&in_child,", ",(allocator *)&child_list);
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,unsigned_long,duckdb::OperatorExpression::ToString<duckdb::OperatorExpression,duckdb::ParsedExpression>(duckdb::OperatorExpression_const&)::_lambda(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>const&)_2_>
              (&op_type,(StringUtil *)&this->children,(long)puVar3 - (long)puVar2 >> 3,&in_child);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&op_type);
    ::std::__cxx11::string::~string((string *)&in_child);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_013292bf;
  case ARRAY_EXTRACT:
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(&this->children,0);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&child_list,pPVar6);
    ::std::operator+(&in_child,&child_list,"[");
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(&this->children,1);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_218,pPVar6);
    ::std::operator+(&op_type,&in_child,&local_218);
    ::std::operator+(__return_storage_ptr__,&op_type,"]");
    ::std::__cxx11::string::~string((string *)&op_type);
    ::std::__cxx11::string::~string((string *)&local_218);
    ::std::__cxx11::string::~string((string *)&in_child);
    pbVar7 = &child_list;
    break;
  case ARRAY_SLICE:
    pvVar10 = &this->children;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(pvVar10,1);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&op_type,pPVar6);
    bVar4 = ::std::operator==(&op_type,"[]");
    if (bVar4) {
      ::std::__cxx11::string::assign((char *)&op_type);
    }
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(pvVar10,2);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&in_child,pPVar6);
    bVar4 = ::std::operator==(&in_child,"[]");
    if (bVar4) {
      ::std::__cxx11::string::assign((char *)&in_child);
    }
    if ((long)(this->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(pvVar10,0);
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar5);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_110,pPVar6);
      ::std::operator+(&local_f0,&local_110,"[");
      ::std::operator+(&local_1b0,&local_f0,&op_type);
      ::std::operator+(&local_1d8,&local_1b0,":");
      ::std::operator+(&local_1f8,&local_1d8,&in_child);
      ::std::operator+(&local_218,&local_1f8,":");
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(pvVar10,3);
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar5);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_130,pPVar6);
      ::std::operator+(&child_list,&local_218,&local_130);
      ::std::operator+(__return_storage_ptr__,&child_list,"]");
      ::std::__cxx11::string::~string((string *)&child_list);
      ::std::__cxx11::string::~string((string *)&local_130);
      ::std::__cxx11::string::~string((string *)&local_218);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1b0);
      ::std::__cxx11::string::~string((string *)&local_f0);
      psVar9 = &local_110;
    }
    else {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(pvVar10,0);
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar5);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_1b0,pPVar6);
      ::std::operator+(&local_1d8,&local_1b0,"[");
      ::std::operator+(&local_1f8,&local_1d8,&op_type);
      ::std::operator+(&local_218,&local_1f8,":");
      ::std::operator+(&child_list,&local_218,&in_child);
      ::std::operator+(__return_storage_ptr__,&child_list,"]");
      ::std::__cxx11::string::~string((string *)&child_list);
      ::std::__cxx11::string::~string((string *)&local_218);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      psVar9 = &local_1b0;
    }
LAB_01329c78:
    ::std::__cxx11::string::~string((string *)psVar9);
    psVar9 = &in_child;
    goto LAB_01329c82;
  case STRUCT_EXTRACT:
    pvVar10 = &this->children;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(pvVar10,1);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    if ((pPVar6->super_BaseExpression).type != VALUE_CONSTANT) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_013292bf;
    }
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(pvVar10,1);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&op_type,pPVar6);
    ::std::__cxx11::string::string((string *)&local_150,"(%s).%s",(allocator *)&child_list);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(pvVar10,0);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_170,pPVar6);
    ::std::__cxx11::string::substr((ulong)&in_child,(ulong)&op_type);
    ::std::__cxx11::string::string((string *)&local_190,(string *)&in_child);
    StringUtil::Format<std::__cxx11::string,duckdb::SQLIdentifier>
              (__return_storage_ptr__,(StringUtil *)&local_150,&local_170,&local_190,in_R8);
    ::std::__cxx11::string::~string((string *)&local_190);
    ::std::__cxx11::string::~string((string *)&in_child);
    ::std::__cxx11::string::~string((string *)&local_170);
    psVar9 = &local_150;
LAB_01329c82:
    ::std::__cxx11::string::~string((string *)psVar9);
    break;
  case ARRAY_CONSTRUCTOR:
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"(ARRAY[",(allocator *)&op_type)
    ;
    puVar2 = (this->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::string((string *)&in_child,", ",(allocator *)&child_list);
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,unsigned_long,duckdb::OperatorExpression::ToString<duckdb::OperatorExpression,duckdb::ParsedExpression>(duckdb::OperatorExpression_const&)::_lambda(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>const&)_3_>
              (&op_type,(StringUtil *)&this->children,(long)puVar3 - (long)puVar2 >> 3,&in_child);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&op_type);
    ::std::__cxx11::string::~string((string *)&in_child);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_013292bf;
  case ARROW:
switchD_013293cf_caseD_9d:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&op_type,"Unrecognized operator type",(allocator *)&in_child);
    InternalException::InternalException(this_00,(string *)&op_type);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case OPERATOR_TRY:
    ::std::__cxx11::string::string((string *)&local_b0,"TRY(%s)",(allocator *)&op_type);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(&this->children,0);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pPVar6->super_BaseExpression)._vptr_BaseExpression;
    (*(code *)pbVar7[2]._M_dataplus._M_p)(&local_d0,pPVar6);
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)&local_b0,&local_d0,pbVar7);
    ::std::__cxx11::string::~string((string *)&local_d0);
    pbVar7 = &local_b0;
    break;
  default:
    switch(EVar1) {
    case OPERATOR_NOT:
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"(",(allocator *)&op_type);
      ExpressionTypeToString_abi_cxx11_
                (&op_type,(duckdb *)(ulong)(this->super_ParsedExpression).super_BaseExpression.type,
                 type_00);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&op_type);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      puVar2 = (this->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::string((string *)&in_child,", ",(allocator *)&child_list);
      StringUtil::
      Join<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,unsigned_long,duckdb::OperatorExpression::ToString<duckdb::OperatorExpression,duckdb::ParsedExpression>(duckdb::OperatorExpression_const&)::_lambda(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>const&)_1_>
                (&op_type,(StringUtil *)&this->children,(long)puVar3 - (long)puVar2 >> 3,&in_child);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&op_type);
      ::std::__cxx11::string::~string((string *)&in_child);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_013292bf;
    case OPERATOR_IS_NULL:
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(&this->children,0);
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar5);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&in_child,pPVar6);
      ::std::operator+(&op_type,"(",&in_child);
      ::std::operator+(__return_storage_ptr__,&op_type," IS NULL)");
      break;
    case OPERATOR_IS_NOT_NULL:
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(&this->children,0);
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar5);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&in_child,pPVar6);
      ::std::operator+(&op_type,"(",&in_child);
      ::std::operator+(__return_storage_ptr__,&op_type," IS NOT NULL)");
      break;
    case OPERATOR_UNPACK:
      ::std::__cxx11::string::string((string *)&local_70,"UNPACK(%s)",(allocator *)&op_type);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(&this->children,0);
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar5);
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (pPVar6->super_BaseExpression)._vptr_BaseExpression;
      (*(code *)pbVar7[2]._M_dataplus._M_p)(&local_90,pPVar6);
      StringUtil::Format<std::__cxx11::string>
                (__return_storage_ptr__,(StringUtil *)&local_70,&local_90,pbVar7);
      ::std::__cxx11::string::~string((string *)&local_90);
      pbVar7 = &local_70;
      goto LAB_013292ba;
    default:
      if (EVar1 - 0x23 < 2) {
        pcVar8 = " NOT IN ";
        if (EVar1 == COMPARE_IN) {
          pcVar8 = " IN ";
        }
        ::std::__cxx11::string::string((string *)&op_type,pcVar8,(allocator *)&in_child);
        pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::get<true>(&this->children,0);
        pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(pvVar5);
        (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&in_child,pPVar6);
        local_1b8 = __return_storage_ptr__;
        ::std::__cxx11::string::string((string *)&child_list,"(",(allocator *)&local_218);
        for (__n = 1; __n < (ulong)((long)(this->children).
                                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->children).
                                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3);
            __n = __n + 1) {
          if (1 < __n) {
            ::std::__cxx11::string::append((char *)&child_list);
          }
          pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   ::get<true>(&this->children,__n);
          pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(pvVar5);
          (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_218,pPVar6);
          ::std::__cxx11::string::append((string *)&child_list);
          ::std::__cxx11::string::~string((string *)&local_218);
        }
        ::std::__cxx11::string::append((char *)&child_list);
        ::std::operator+(&local_1d8,"(",&in_child);
        __return_storage_ptr__ = local_1b8;
        ::std::operator+(&local_1f8,&local_1d8,&op_type);
        ::std::operator+(&local_218,&local_1f8,&child_list);
        ::std::operator+(__return_storage_ptr__,&local_218,")");
        ::std::__cxx11::string::~string((string *)&local_218);
        ::std::__cxx11::string::~string((string *)&local_1f8);
        ::std::__cxx11::string::~string((string *)&local_1d8);
        psVar9 = &child_list;
        goto LAB_01329c78;
      }
      if (EVar1 != GROUPING_FUNCTION) goto switchD_013293cf_caseD_9d;
      goto switchD_013293cf_caseD_98;
    }
    ::std::__cxx11::string::~string((string *)&op_type);
    pbVar7 = &in_child;
  }
LAB_013292ba:
  ::std::__cxx11::string::~string((string *)pbVar7);
LAB_013292bf:
  ::std::__cxx11::string::~string((string *)&op);
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		auto op = ExpressionTypeToOperator(entry.GetExpressionType());
		if (!op.empty()) {
			// use the operator string to represent the operator
			D_ASSERT(entry.children.size() == 2);
			return entry.children[0]->ToString() + " " + op + " " + entry.children[1]->ToString();
		}
		switch (entry.GetExpressionType()) {
		case ExpressionType::COMPARE_IN:
		case ExpressionType::COMPARE_NOT_IN: {
			string op_type = entry.GetExpressionType() == ExpressionType::COMPARE_IN ? " IN " : " NOT IN ";
			string in_child = entry.children[0]->ToString();
			string child_list = "(";
			for (idx_t i = 1; i < entry.children.size(); i++) {
				if (i > 1) {
					child_list += ", ";
				}
				child_list += entry.children[i]->ToString();
			}
			child_list += ")";
			return "(" + in_child + op_type + child_list + ")";
		}
		case ExpressionType::OPERATOR_UNPACK: {
			return StringUtil::Format("UNPACK(%s)", entry.children[0]->ToString());
		}
		case ExpressionType::OPERATOR_TRY: {
			return StringUtil::Format("TRY(%s)", entry.children[0]->ToString());
		}
		case ExpressionType::OPERATOR_NOT: {
			string result = "(";
			result += ExpressionTypeToString(entry.GetExpressionType());
			result += " ";
			result += StringUtil::Join(entry.children, entry.children.size(), ", ",
			                           [](const unique_ptr<BASE> &child) { return child->ToString(); });
			result += ")";
			return result;
		}
		case ExpressionType::GROUPING_FUNCTION:
		case ExpressionType::OPERATOR_COALESCE: {
			string result = ExpressionTypeToString(entry.GetExpressionType());
			result += "(";
			result += StringUtil::Join(entry.children, entry.children.size(), ", ",
			                           [](const unique_ptr<BASE> &child) { return child->ToString(); });
			result += ")";
			return result;
		}
		case ExpressionType::OPERATOR_IS_NULL:
			return "(" + entry.children[0]->ToString() + " IS NULL)";
		case ExpressionType::OPERATOR_IS_NOT_NULL:
			return "(" + entry.children[0]->ToString() + " IS NOT NULL)";
		case ExpressionType::ARRAY_EXTRACT:
			return entry.children[0]->ToString() + "[" + entry.children[1]->ToString() + "]";
		case ExpressionType::ARRAY_SLICE: {
			string begin = entry.children[1]->ToString();
			if (begin == "[]") {
				begin = "";
			}
			string end = entry.children[2]->ToString();
			if (end == "[]") {
				if (entry.children.size() == 4) {
					end = "-";
				} else {
					end = "";
				}
			}
			if (entry.children.size() == 4) {
				return entry.children[0]->ToString() + "[" + begin + ":" + end + ":" + entry.children[3]->ToString() +
				       "]";
			}
			return entry.children[0]->ToString() + "[" + begin + ":" + end + "]";
		}
		case ExpressionType::STRUCT_EXTRACT: {
			if (entry.children[1]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
				return string();
			}
			auto child_string = entry.children[1]->ToString();
			D_ASSERT(child_string.size() >= 3);
			D_ASSERT(child_string[0] == '\'' && child_string[child_string.size() - 1] == '\'');
			return StringUtil::Format("(%s).%s", entry.children[0]->ToString(),
			                          SQLIdentifier(child_string.substr(1, child_string.size() - 2)));
		}
		case ExpressionType::ARRAY_CONSTRUCTOR: {
			string result = "(ARRAY[";
			result += StringUtil::Join(entry.children, entry.children.size(), ", ",
			                           [](const unique_ptr<BASE> &child) { return child->ToString(); });
			result += "])";
			return result;
		}
		default:
			throw InternalException("Unrecognized operator type");
		}
	}